

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::SharedCtor
          (NonMaximumSuppressionLayerParams *this)

{
  this->iouthreshold_ = 0.0;
  this->scorethreshold_ = 0.0;
  this->maxboxes_ = 0;
  this->perclasssuppression_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void NonMaximumSuppressionLayerParams::SharedCtor() {
  ::memset(&iouthreshold_, 0, reinterpret_cast<char*>(&perclasssuppression_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(perclasssuppression_));
  _cached_size_ = 0;
}